

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O3

void __thiscall FDecalLib::ReadAllDecals(FDecalLib *this)

{
  FDecalBase *root;
  BYTE *pBVar1;
  PClassActor **ppPVar2;
  int iVar3;
  uint uVar4;
  FDecalBase *pFVar5;
  FDecalAnimator **ppFVar6;
  ulong uVar7;
  ulong uVar8;
  int lastlump;
  FScanner sc;
  int local_13c;
  NameEntry *local_138;
  FScanner local_130;
  
  local_13c = 0;
  if (Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Count != 0) {
    uVar8 = 0;
    ppFVar6 = Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Array;
    uVar4 = Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Count;
    do {
      if (ppFVar6[uVar8] != (FDecalAnimator *)0x0) {
        (*ppFVar6[uVar8]->_vptr_FDecalAnimator[1])();
        ppFVar6 = Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Array;
        uVar4 = Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Count;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar4);
    if (uVar4 != 0) {
      Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Count = 0;
    }
  }
  if (FDecalCombinerAnim::AnimatorList.Count != 0) {
    FDecalCombinerAnim::AnimatorList.Count = 0;
  }
  if (DecalTranslations.Count != 0) {
    DecalTranslations.Count = 0;
  }
  Clear(&DecalLibrary);
  iVar3 = FWadCollection::FindLump(&Wads,"DECALDEF",&local_13c,false);
  if (iVar3 != -1) {
    do {
      FScanner::FScanner(&local_130,iVar3);
      ReadDecals(this,&local_130);
      FScanner::~FScanner(&local_130);
      iVar3 = FWadCollection::FindLump(&Wads,"DECALDEF",&local_13c,false);
    } while (iVar3 != -1);
  }
  iVar3 = FName::NameData.NumNames;
  ppPVar2 = PClassActor::AllActorClasses.Array;
  uVar8 = (ulong)PClassActor::AllActorClasses.Count;
  if (uVar8 != 0) {
    local_138 = FName::NameData.NameArray;
    root = this->Root;
    uVar7 = 0;
    do {
      pBVar1 = (ppPVar2[uVar7]->super_PClass).Defaults;
      uVar4 = (uint)*(undefined8 *)(pBVar1 + 0x478);
      if (uVar4 < (uint)iVar3) {
        pFVar5 = ScanTreeForName(local_138[(int)uVar4].Text,root);
        *(FDecalBase **)(pBVar1 + 0x478) = pFVar5;
      }
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
  }
  return;
}

Assistant:

void FDecalLib::ReadAllDecals ()
{
	int lump, lastlump = 0;
	unsigned int i;

	for(unsigned i=0;i<Animators.Size(); i++)
	{
		delete Animators[i];
	}
	Animators.Clear();
	FDecalCombinerAnim::AnimatorList.Clear();
	DecalTranslations.Clear();

	DecalLibrary.Clear();

	while ((lump = Wads.FindLump ("DECALDEF", &lastlump)) != -1)
	{
		FScanner sc(lump);
		ReadDecals (sc);
	}
	// Supporting code to allow specifying decals directly in the DECORATE lump
	for (i = 0; i < PClassActor::AllActorClasses.Size(); i++)
	{
		AActor *def = (AActor*)GetDefaultByType (PClassActor::AllActorClasses[i]);

		FName v = ENamedName(intptr_t(def->DecalGenerator));
		if (v.IsValidName())
		{
			def->DecalGenerator = ScanTreeForName (v, Root);
		}
	}
}